

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O3

FunctionBody * TTD::JsSupport::ForceAndGetFunctionBody(ParseableFunctionInfo *pfi)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  FunctionInfo *pFVar4;
  DeferDeserializeFunctionInfo *this;
  ParseableFunctionInfo *this_00;
  
  pFVar4 = (pfi->super_FunctionProxy).functionInfo.ptr;
  if (pFVar4 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                       ,0x530,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar2) goto LAB_0092a2b1;
    *puVar3 = 0;
    pFVar4 = (pfi->super_FunctionProxy).functionInfo.ptr;
  }
  if ((ParseableFunctionInfo *)(pFVar4->functionBodyImpl).ptr != pfi) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                       ,0x531,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                       "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar2) goto LAB_0092a2b1;
    *puVar3 = 0;
    pFVar4 = (pfi->super_FunctionProxy).functionInfo.ptr;
  }
  if ((pFVar4->attributes & DeferredDeserialize) == None) {
    if ((ParseableFunctionInfo *)(pFVar4->functionBodyImpl).ptr != pfi) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                         ,0x53f,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                         "GetFunctionInfo()->GetFunctionProxy() == this");
      if (!bVar2) goto LAB_0092a2b1;
      *puVar3 = 0;
      pFVar4 = (pfi->super_FunctionProxy).functionInfo.ptr;
    }
    if ((pFVar4->attributes & DeferredParse) == None) {
      bVar2 = Js::FunctionProxy::IsFunctionBody(&pfi->super_FunctionProxy);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                           ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
        if (!bVar2) {
LAB_0092a2b1:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
      goto LAB_0092a2a1;
    }
    this_00 = Js::FunctionProxy::GetParseableFunctionInfo(&pfi->super_FunctionProxy);
    pfi = &Js::ParseableFunctionInfo::Parse(this_00,(ScriptFunction **)0x0,false)->
           super_ParseableFunctionInfo;
  }
  else {
    this = Js::FunctionProxy::GetDeferDeserializeFunctionInfo(&pfi->super_FunctionProxy);
    pfi = &Js::DeferDeserializeFunctionInfo::Deserialize(this)->super_ParseableFunctionInfo;
  }
  if ((FunctionBody *)pfi == (FunctionBody *)0x0) {
    TTDAbort_unrecoverable_error("I just want a function body!!!");
  }
LAB_0092a2a1:
  Js::FunctionProxy::EnsureDeserialized(&pfi->super_FunctionProxy);
  return (FunctionBody *)pfi;
}

Assistant:

Js::FunctionBody* ForceAndGetFunctionBody(Js::ParseableFunctionInfo* pfi)
        {
            Js::FunctionBody* fb = nullptr;

            if(pfi->IsDeferredDeserializeFunction())
            {
                Js::DeferDeserializeFunctionInfo* deferDeserializeInfo = pfi->GetDeferDeserializeFunctionInfo();
                fb = deferDeserializeInfo->Deserialize();
            }
            else
            {
                if(pfi->IsDeferredParseFunction())
                {
                    fb = pfi->GetParseableFunctionInfo()->Parse();
                }
                else
                {
                    fb = pfi->GetFunctionBody();
                }
            }
            TTDAssert(fb != nullptr, "I just want a function body!!!");

            fb->EnsureDeserialized();
            return fb;
        }